

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall
cmTarget::GetMappedConfig
          (cmTarget *this,string *desired_config,cmValue *loc,cmValue *imp,string *suffix)

{
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  string *psVar4;
  reference pbVar5;
  cmValue cVar6;
  string_view sVar7;
  bool local_7c1;
  bool local_75d;
  bool local_75b;
  bool local_759;
  cmAlphaNum local_738;
  cmAlphaNum local_708;
  undefined1 local_6d8 [8];
  string impProp_2;
  cmAlphaNum local_6b0;
  cmAlphaNum local_680;
  undefined1 local_650 [8];
  string locProp_2;
  cmAlphaNum local_610;
  cmAlphaNum local_5e0;
  string local_5b0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_590;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_588;
  iterator aci;
  allocator<char> local_569;
  string local_568;
  cmValue local_548;
  cmValue iconfigs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  availableConfigs;
  string local_520;
  string *local_500;
  string *local_4f8;
  string *local_4f0;
  cmAlphaNum local_4e8;
  cmAlphaNum local_4b8;
  undefined1 local_488 [8];
  string impProp_1;
  cmAlphaNum local_460;
  cmAlphaNum local_430;
  undefined1 local_400 [8];
  string locProp_1;
  cmAlphaNum local_3d8;
  cmAlphaNum local_3a8;
  string local_378;
  string *local_358;
  cmAlphaNum local_350;
  cmAlphaNum local_320;
  undefined1 local_2f0 [8];
  string impProp;
  cmAlphaNum local_2c8;
  cmAlphaNum local_298;
  undefined1 local_268 [8];
  string locProp;
  string mcUpper;
  string local_220;
  string *local_200;
  string *local_1f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e8;
  iterator mci;
  bool allowImp;
  cmValue local_1c8;
  cmValue mapValue;
  cmAlphaNum local_190;
  undefined1 local_160 [8];
  string mapProp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mappedConfigs;
  cmAlphaNum local_f8;
  string local_c8;
  undefined1 local_a8 [8];
  string locPropBase;
  string local_78;
  undefined1 local_58 [8];
  string config_upper;
  string *suffix_local;
  cmValue *imp_local;
  cmValue *loc_local;
  string *desired_config_local;
  cmTarget *this_local;
  
  config_upper.field_2._8_8_ = suffix;
  std::__cxx11::string::string((string *)local_58);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmsys::SystemTools::UpperCase(&local_78,desired_config);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::__cxx11::string::string((string *)local_a8);
  TVar2 = GetType(this);
  if (TVar2 == INTERFACE_LIBRARY) {
    std::__cxx11::string::operator=((string *)local_a8,"IMPORTED_LIBNAME");
  }
  else {
    TVar2 = GetType(this);
    if (TVar2 == OBJECT_LIBRARY) {
      std::__cxx11::string::operator=((string *)local_a8,"IMPORTED_OBJECTS");
    }
    else {
      std::__cxx11::string::operator=((string *)local_a8,"IMPORTED_LOCATION");
    }
  }
  cmAlphaNum::cmAlphaNum(&local_f8,'_');
  cmAlphaNum::cmAlphaNum
            ((cmAlphaNum *)
             &mappedConfigs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_58);
  cmStrCat<>(&local_c8,&local_f8,
             (cmAlphaNum *)
             &mappedConfigs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::operator=((string *)config_upper.field_2._8_8_,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&mapProp.field_2 + 8));
  cmAlphaNum::cmAlphaNum(&local_190,"MAP_IMPORTED_CONFIG_");
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&mapValue,(string *)local_58);
  cmStrCat<>((string *)local_160,&local_190,(cmAlphaNum *)&mapValue);
  local_1c8 = GetProperty(this,(string *)local_160);
  bVar1 = cmValue::operator_cast_to_bool(&local_1c8);
  if (bVar1) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_1c8);
    sVar7 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
    cmExpandList(sVar7,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&mapProp.field_2 + 8),true);
  }
  std::__cxx11::string::~string((string *)local_160);
  bVar1 = IsDLLPlatform(this);
  if (bVar1) {
    TVar2 = GetType(this);
    local_759 = true;
    if (TVar2 == SHARED_LIBRARY) goto LAB_003f507d;
    bVar1 = IsExecutableWithExports(this);
    local_759 = true;
    if (bVar1) goto LAB_003f507d;
  }
  bVar1 = IsAIX(this);
  local_75b = false;
  if (bVar1) {
    local_75b = IsExecutableWithExports(this);
  }
  local_759 = local_75b;
LAB_003f507d:
  mci._M_current._7_1_ = local_759;
  local_1e8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&mapProp.field_2 + 8));
  while( true ) {
    bVar1 = cmValue::operator_cast_to_bool(loc);
    local_75d = false;
    if (!bVar1) {
      bVar1 = cmValue::operator_cast_to_bool(imp);
      local_75d = false;
      if (!bVar1) {
        local_1f0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&mapProp.field_2 + 8));
        local_75d = __gnu_cxx::operator!=(&local_1e8,&local_1f0);
      }
    }
    if (local_75d == false) break;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_1e8);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pbVar5 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_1e8);
      cmsys::SystemTools::UpperCase((string *)((long)&locProp.field_2 + 8),pbVar5);
      cmAlphaNum::cmAlphaNum(&local_298,(string *)local_a8);
      cmAlphaNum::cmAlphaNum(&local_2c8,'_');
      cmStrCat<std::__cxx11::string>
                ((string *)local_268,&local_298,&local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&locProp.field_2 + 8));
      impProp.field_2._8_8_ = GetProperty(this,(string *)local_268);
      loc->Value = (string *)impProp.field_2._8_8_;
      if ((mci._M_current._7_1_ & 1) != 0) {
        cmAlphaNum::cmAlphaNum(&local_320,"IMPORTED_IMPLIB_");
        cmAlphaNum::cmAlphaNum(&local_350,(string *)((long)&locProp.field_2 + 8));
        cmStrCat<>((string *)local_2f0,&local_320,&local_350);
        local_358 = (string *)GetProperty(this,(string *)local_2f0);
        imp->Value = local_358;
        std::__cxx11::string::~string((string *)local_2f0);
      }
      bVar1 = cmValue::operator_cast_to_bool(loc);
      if ((bVar1) || (bVar1 = cmValue::operator_cast_to_bool(imp), bVar1)) {
        cmAlphaNum::cmAlphaNum(&local_3a8,'_');
        cmAlphaNum::cmAlphaNum(&local_3d8,(string *)((long)&locProp.field_2 + 8));
        cmStrCat<>(&local_378,&local_3a8,&local_3d8);
        std::__cxx11::string::operator=((string *)config_upper.field_2._8_8_,(string *)&local_378);
        std::__cxx11::string::~string((string *)&local_378);
      }
      std::__cxx11::string::~string((string *)local_268);
      std::__cxx11::string::~string((string *)(locProp.field_2._M_local_buf + 8));
    }
    else {
      local_1f8 = (string *)GetProperty(this,(string *)local_a8);
      loc->Value = local_1f8;
      if ((mci._M_current._7_1_ & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_220,"IMPORTED_IMPLIB",
                   (allocator<char> *)(mcUpper.field_2._M_local_buf + 0xf));
        local_200 = (string *)GetProperty(this,&local_220);
        imp->Value = local_200;
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator((allocator<char> *)(mcUpper.field_2._M_local_buf + 0xf));
      }
      bVar1 = cmValue::operator_cast_to_bool(loc);
      if ((bVar1) || (bVar1 = cmValue::operator_cast_to_bool(imp), bVar1)) {
        std::__cxx11::string::clear();
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_1e8);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&mapProp.field_2 + 8));
  if (((bVar1) || (bVar1 = cmValue::operator_cast_to_bool(loc), bVar1)) ||
     (bVar1 = cmValue::operator_cast_to_bool(imp), bVar1)) {
    bVar1 = cmValue::operator_cast_to_bool(loc);
    if ((!bVar1) && (bVar1 = cmValue::operator_cast_to_bool(imp), !bVar1)) {
      cmAlphaNum::cmAlphaNum(&local_430,(string *)local_a8);
      cmAlphaNum::cmAlphaNum(&local_460,(string *)config_upper.field_2._8_8_);
      cmStrCat<>((string *)local_400,&local_430,&local_460);
      impProp_1.field_2._8_8_ = GetProperty(this,(string *)local_400);
      loc->Value = (string *)impProp_1.field_2._8_8_;
      if ((mci._M_current._7_1_ & 1) != 0) {
        cmAlphaNum::cmAlphaNum(&local_4b8,"IMPORTED_IMPLIB");
        cmAlphaNum::cmAlphaNum(&local_4e8,(string *)config_upper.field_2._8_8_);
        cmStrCat<>((string *)local_488,&local_4b8,&local_4e8);
        local_4f0 = (string *)GetProperty(this,(string *)local_488);
        imp->Value = local_4f0;
        std::__cxx11::string::~string((string *)local_488);
      }
      std::__cxx11::string::~string((string *)local_400);
    }
    bVar1 = cmValue::operator_cast_to_bool(loc);
    if ((!bVar1) && (bVar1 = cmValue::operator_cast_to_bool(imp), !bVar1)) {
      std::__cxx11::string::clear();
      local_4f8 = (string *)GetProperty(this,(string *)local_a8);
      loc->Value = local_4f8;
      if ((mci._M_current._7_1_ & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_520,"IMPORTED_IMPLIB",
                   (allocator<char> *)
                   ((long)&availableConfigs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        local_500 = (string *)GetProperty(this,&local_520);
        imp->Value = local_500;
        std::__cxx11::string::~string((string *)&local_520);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&availableConfigs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
    }
    bVar1 = cmValue::operator_cast_to_bool(loc);
    if ((!bVar1) && (bVar1 = cmValue::operator_cast_to_bool(imp), !bVar1)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&iconfigs);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_568,"IMPORTED_CONFIGURATIONS",&local_569);
      local_548 = GetProperty(this,&local_568);
      std::__cxx11::string::~string((string *)&local_568);
      std::allocator<char>::~allocator(&local_569);
      bVar1 = cmValue::operator_cast_to_bool(&local_548);
      if (bVar1) {
        psVar4 = cmValue::operator*[abi_cxx11_(&local_548);
        sVar7 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
        aci._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar7._M_len;
        cmExpandList(sVar7,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&iconfigs,false);
      }
      local_588._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&iconfigs);
      while( true ) {
        bVar1 = cmValue::operator_cast_to_bool(loc);
        local_7c1 = false;
        if (!bVar1) {
          bVar1 = cmValue::operator_cast_to_bool(imp);
          local_7c1 = false;
          if (!bVar1) {
            local_590._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&iconfigs);
            local_7c1 = __gnu_cxx::operator!=(&local_588,&local_590);
          }
        }
        if (local_7c1 == false) break;
        cmAlphaNum::cmAlphaNum(&local_5e0,'_');
        pbVar5 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_588);
        cmsys::SystemTools::UpperCase((string *)((long)&locProp_2.field_2 + 8),pbVar5);
        cmAlphaNum::cmAlphaNum(&local_610,(string *)((long)&locProp_2.field_2 + 8));
        cmStrCat<>(&local_5b0,&local_5e0,&local_610);
        std::__cxx11::string::operator=((string *)config_upper.field_2._8_8_,(string *)&local_5b0);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::__cxx11::string::~string((string *)(locProp_2.field_2._M_local_buf + 8));
        cmAlphaNum::cmAlphaNum(&local_680,(string *)local_a8);
        cmAlphaNum::cmAlphaNum(&local_6b0,(string *)config_upper.field_2._8_8_);
        cmStrCat<>((string *)local_650,&local_680,&local_6b0);
        impProp_2.field_2._8_8_ = GetProperty(this,(string *)local_650);
        loc->Value = (string *)impProp_2.field_2._8_8_;
        if ((mci._M_current._7_1_ & 1) != 0) {
          cmAlphaNum::cmAlphaNum(&local_708,"IMPORTED_IMPLIB");
          cmAlphaNum::cmAlphaNum(&local_738,(string *)config_upper.field_2._8_8_);
          cmStrCat<>((string *)local_6d8,&local_708,&local_738);
          cVar6 = GetProperty(this,(string *)local_6d8);
          imp->Value = (string *)cVar6;
          std::__cxx11::string::~string((string *)local_6d8);
        }
        std::__cxx11::string::~string((string *)local_650);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_588);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&iconfigs);
    }
    bVar1 = cmValue::operator_cast_to_bool(loc);
    if ((bVar1) || (bVar1 = cmValue::operator_cast_to_bool(imp), bVar1)) {
      this_local._7_1_ = true;
    }
    else {
      TVar2 = GetType(this);
      this_local._7_1_ = TVar2 == INTERFACE_LIBRARY;
    }
  }
  else {
    TVar2 = GetType(this);
    this_local._7_1_ = TVar2 == INTERFACE_LIBRARY;
  }
  locProp_1.field_2._12_4_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&mapProp.field_2 + 8));
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_58);
  return this_local._7_1_;
}

Assistant:

bool cmTarget::GetMappedConfig(std::string const& desired_config, cmValue& loc,
                               cmValue& imp, std::string& suffix) const
{
  std::string config_upper;
  if (!desired_config.empty()) {
    config_upper = cmSystemTools::UpperCase(desired_config);
  }

  std::string locPropBase;
  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    locPropBase = "IMPORTED_LIBNAME";
  } else if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    locPropBase = "IMPORTED_OBJECTS";
  } else {
    locPropBase = "IMPORTED_LOCATION";
  }

  // Track the configuration-specific property suffix.
  suffix = cmStrCat('_', config_upper);

  std::vector<std::string> mappedConfigs;
  {
    std::string mapProp = cmStrCat("MAP_IMPORTED_CONFIG_", config_upper);
    if (cmValue mapValue = this->GetProperty(mapProp)) {
      cmExpandList(*mapValue, mappedConfigs, true);
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // On a DLL platform there may be only IMPORTED_IMPLIB for a shared
  // library or an executable with exports.
  bool allowImp = (this->IsDLLPlatform() &&
                   (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
                    this->IsExecutableWithExports())) ||
    (this->IsAIX() && this->IsExecutableWithExports());

  // If a mapping was found, check its configurations.
  for (auto mci = mappedConfigs.begin();
       !loc && !imp && mci != mappedConfigs.end(); ++mci) {
    // Look for this configuration.
    if (mci->empty()) {
      // An empty string in the mapping has a special meaning:
      // look up the config-less properties.
      loc = this->GetProperty(locPropBase);
      if (allowImp) {
        imp = this->GetProperty("IMPORTED_IMPLIB");
      }
      // If it was found, set the suffix.
      if (loc || imp) {
        suffix.clear();
      }
    } else {
      std::string mcUpper = cmSystemTools::UpperCase(*mci);
      std::string locProp = cmStrCat(locPropBase, '_', mcUpper);
      loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = cmStrCat("IMPORTED_IMPLIB_", mcUpper);
        imp = this->GetProperty(impProp);
      }

      // If it was found, use it for all properties below.
      if (loc || imp) {
        suffix = cmStrCat('_', mcUpper);
      }
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // then the target location is not found.  The project does not want
  // any other configuration.
  if (!mappedConfigs.empty() && !loc && !imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  // If we have not yet found it then there are no mapped
  // configurations.  Look for an exact-match.
  if (!loc && !imp) {
    std::string locProp = cmStrCat(locPropBase, suffix);
    loc = this->GetProperty(locProp);
    if (allowImp) {
      std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
      imp = this->GetProperty(impProp);
    }
  }

  // If we have not yet found it then there are no mapped
  // configurations and no exact match.
  if (!loc && !imp) {
    // The suffix computed above is not useful.
    suffix.clear();

    // Look for a configuration-less location.  This may be set by
    // manually-written code.
    loc = this->GetProperty(locPropBase);
    if (allowImp) {
      imp = this->GetProperty("IMPORTED_IMPLIB");
    }
  }

  // If we have not yet found it then the project is willing to try
  // any available configuration.
  if (!loc && !imp) {
    std::vector<std::string> availableConfigs;
    if (cmValue iconfigs = this->GetProperty("IMPORTED_CONFIGURATIONS")) {
      cmExpandList(*iconfigs, availableConfigs);
    }
    for (auto aci = availableConfigs.begin();
         !loc && !imp && aci != availableConfigs.end(); ++aci) {
      suffix = cmStrCat('_', cmSystemTools::UpperCase(*aci));
      std::string locProp = cmStrCat(locPropBase, suffix);
      loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
        imp = this->GetProperty(impProp);
      }
    }
  }
  // If we have not yet found it then the target location is not available.
  if (!loc && !imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  return true;
}